

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerGLSL::attempt_emit_loop_header
          (CompilerGLSL *this,SPIRBlock *block,Method method)

{
  bool bVar1;
  uint32_t uVar2;
  TypedID<(spirv_cross::Types)6> TVar3;
  SPIRBlock *pSVar4;
  SPIRBlock *pSVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  bool local_322;
  bool local_2c1;
  BlockID local_2b8;
  BlockID local_2b4;
  string local_2b0;
  string local_290;
  undefined1 local_270 [8];
  string condition_3;
  string continue_block_1;
  string local_210;
  undefined1 local_1f0 [8];
  string condition_2;
  string initializer_1;
  uint32_t target_block;
  _Node_iterator_base<unsigned_int,_false> _Stack_198;
  bool flushes_phi_1;
  uint32_t local_18c;
  _Node_iterator_base<unsigned_int,_false> local_188;
  byte local_17d;
  uint32_t local_17c;
  bool condition_is_temporary_1;
  SPIRBlock *pSStack_178;
  uint32_t current_count_1;
  SPIRBlock *child;
  string local_150;
  undefined1 local_130 [8];
  string condition_1;
  string continue_block;
  string local_d0;
  undefined1 local_a0 [8];
  string condition;
  string initializer;
  _Node_iterator_base<unsigned_int,_false> _Stack_48;
  bool flushes_phi;
  uint32_t local_3c;
  _Node_iterator_base<unsigned_int,_false> local_38;
  byte local_2d;
  uint32_t local_2c;
  ContinueBlockType CStack_28;
  bool condition_is_temporary;
  uint32_t current_count;
  ContinueBlockType continue_type;
  Method method_local;
  SPIRBlock *block_local;
  CompilerGLSL *this_local;
  
  current_count = method;
  _continue_type = block;
  block_local = (SPIRBlock *)this;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&block->continue_block);
  pSVar4 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar2);
  CStack_28 = Compiler::continue_block_type(&this->super_Compiler,pSVar4);
  if ((current_count == 0) || (current_count == 2)) {
    local_2c = this->statement_count;
    emit_block_instructions_with_masked_debug(this,_continue_type);
    local_3c = TypedID::operator_cast_to_unsigned_int((TypedID *)&_continue_type->condition);
    local_38._M_cur =
         (__node_type *)
         ::std::
         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
         ::find(&(this->super_Compiler).forced_temporaries,&local_3c);
    _Stack_48._M_cur =
         (__node_type *)
         ::std::
         end<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>
                   (&(this->super_Compiler).forced_temporaries);
    local_2d = ::std::__detail::operator==(&local_38,&stack0xffffffffffffffb8);
    TVar3 = TypedID::operator_cast_to_TypedID((TypedID *)&(_continue_type->super_IVariant).self);
    bVar1 = Compiler::flush_phi_required
                      (&this->super_Compiler,(BlockID)TVar3.id,
                       (BlockID)(_continue_type->true_block).id);
    local_2c1 = true;
    if (!bVar1) {
      TVar3 = TypedID::operator_cast_to_TypedID((TypedID *)&(_continue_type->super_IVariant).self);
      local_2c1 = Compiler::flush_phi_required
                            (&this->super_Compiler,(BlockID)TVar3.id,
                             (BlockID)(_continue_type->false_block).id);
    }
    if (((local_2c1 == false) && (local_2c == this->statement_count)) && ((local_2d & 1) != 0)) {
      if (CStack_28 == ForLoop) {
        flush_undeclared_variables(this,_continue_type);
        emit_for_loop_initializers_abi_cxx11_
                  ((string *)((long)&condition.field_2 + 8),this,_continue_type);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_continue_type->condition);
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
        to_expression_abi_cxx11_((string *)local_a0,this,uVar2,true);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_continue_type->true_block);
        pSVar4 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar2);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_continue_type->merge_block);
        pSVar5 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar2);
        bVar1 = Compiler::execution_is_noop(&this->super_Compiler,pSVar4,pSVar5);
        if (bVar1) {
          enclose_expression((string *)((long)&continue_block.field_2 + 8),this,(string *)local_a0);
          join<char_const(&)[2],std::__cxx11::string>
                    (&local_d0,(spirv_cross *)0x62c6fb,
                     (char (*) [2])((long)&continue_block.field_2 + 8),pbVar6);
          ::std::__cxx11::string::operator=((string *)local_a0,(string *)&local_d0);
          ::std::__cxx11::string::~string((string *)&local_d0);
          ::std::__cxx11::string::~string((string *)(continue_block.field_2._M_local_buf + 8));
        }
        (*(this->super_Compiler)._vptr_Compiler[0x38])(this,_continue_type);
        if (current_count == 2) {
          statement<char_const(&)[6],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[4]>
                    (this,(char (*) [6])"for (",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&condition.field_2 + 8),(char (*) [3])0x663378,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     (char (*) [4])"; )");
        }
        else {
          uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_continue_type->continue_block)
          ;
          emit_continue_block_abi_cxx11_
                    ((string *)((long)&condition_1.field_2 + 8),this,uVar2,false,false);
          statement<char_const(&)[6],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                    (this,(char (*) [6])"for (",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&condition.field_2 + 8),(char (*) [3])0x663378,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     (char (*) [3])0x663378,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&condition_1.field_2 + 8),(char (*) [2])0x682405);
          ::std::__cxx11::string::~string((string *)(condition_1.field_2._M_local_buf + 8));
        }
        ::std::__cxx11::string::~string((string *)local_a0);
        ::std::__cxx11::string::~string((string *)(condition.field_2._M_local_buf + 8));
      }
      else {
        if (CStack_28 != WhileLoop) {
          _continue_type->disable_block_optimization = true;
          Compiler::force_recompile(&this->super_Compiler);
          begin_scope(this);
          return false;
        }
        flush_undeclared_variables(this,_continue_type);
        emit_while_loop_initializers(this,_continue_type);
        (*(this->super_Compiler)._vptr_Compiler[0x38])(this,_continue_type);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_continue_type->condition);
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
        to_expression_abi_cxx11_((string *)local_130,this,uVar2,true);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_continue_type->true_block);
        pSVar4 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar2);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_continue_type->merge_block);
        pSVar5 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar2);
        bVar1 = Compiler::execution_is_noop(&this->super_Compiler,pSVar4,pSVar5);
        if (bVar1) {
          enclose_expression((string *)&child,this,(string *)local_130);
          join<char_const(&)[2],std::__cxx11::string>
                    (&local_150,(spirv_cross *)0x62c6fb,(char (*) [2])&child,pbVar6);
          ::std::__cxx11::string::operator=((string *)local_130,(string *)&local_150);
          ::std::__cxx11::string::~string((string *)&local_150);
          ::std::__cxx11::string::~string((string *)&child);
        }
        statement<char_const(&)[8],std::__cxx11::string&,char_const(&)[2]>
                  (this,(char (*) [8])"while (",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                   (char (*) [2])0x682405);
        ::std::__cxx11::string::~string((string *)local_130);
      }
      begin_scope(this);
      this_local._7_1_ = true;
    }
    else {
      _continue_type->disable_block_optimization = true;
      Compiler::force_recompile(&this->super_Compiler);
      begin_scope(this);
      this_local._7_1_ = false;
    }
  }
  else if (current_count == 1) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_continue_type->next_block);
    pSStack_178 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar2);
    flush_undeclared_variables(this,pSStack_178);
    local_17c = this->statement_count;
    emit_block_instructions_with_masked_debug(this,pSStack_178);
    local_18c = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_178->condition);
    local_188._M_cur =
         (__node_type *)
         ::std::
         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
         ::find(&(this->super_Compiler).forced_temporaries,&local_18c);
    _Stack_198._M_cur =
         (__node_type *)
         ::std::
         end<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>
                   (&(this->super_Compiler).forced_temporaries);
    local_17d = ::std::__detail::operator==(&local_188,&stack0xfffffffffffffe68);
    TVar3 = TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_178->super_IVariant).self);
    bVar1 = Compiler::flush_phi_required
                      (&this->super_Compiler,(BlockID)TVar3.id,(BlockID)(pSStack_178->true_block).id
                      );
    local_322 = true;
    if (!bVar1) {
      TVar3 = TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_178->super_IVariant).self);
      local_322 = Compiler::flush_phi_required
                            (&this->super_Compiler,(BlockID)TVar3.id,
                             (BlockID)(pSStack_178->false_block).id);
    }
    if (((local_322 == false) && (local_17c == this->statement_count)) && ((local_17d & 1) != 0)) {
      initializer_1.field_2._8_4_ =
           TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_178->true_block);
      if (CStack_28 == ForLoop) {
        emit_for_loop_initializers_abi_cxx11_
                  ((string *)((long)&condition_2.field_2 + 8),this,_continue_type);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_178->condition);
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
        to_expression_abi_cxx11_((string *)local_1f0,this,uVar2,true);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_178->true_block);
        pSVar4 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar2);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_continue_type->merge_block);
        pSVar5 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar2);
        bVar1 = Compiler::execution_is_noop(&this->super_Compiler,pSVar4,pSVar5);
        if (bVar1) {
          enclose_expression((string *)((long)&continue_block_1.field_2 + 8),this,
                             (string *)local_1f0);
          join<char_const(&)[2],std::__cxx11::string>
                    (&local_210,(spirv_cross *)0x62c6fb,
                     (char (*) [2])((long)&continue_block_1.field_2 + 8),pbVar6);
          ::std::__cxx11::string::operator=((string *)local_1f0,(string *)&local_210);
          ::std::__cxx11::string::~string((string *)&local_210);
          ::std::__cxx11::string::~string((string *)(continue_block_1.field_2._M_local_buf + 8));
          initializer_1.field_2._8_4_ =
               TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_178->false_block);
        }
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_continue_type->continue_block);
        emit_continue_block_abi_cxx11_
                  ((string *)((long)&condition_3.field_2 + 8),this,uVar2,false,false);
        (*(this->super_Compiler)._vptr_Compiler[0x38])(this,_continue_type);
        statement<char_const(&)[6],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                  (this,(char (*) [6])"for (",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&condition_2.field_2 + 8),(char (*) [3])0x663378,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                   (char (*) [3])0x663378,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&condition_3.field_2 + 8),(char (*) [2])0x682405);
        ::std::__cxx11::string::~string((string *)(condition_3.field_2._M_local_buf + 8));
        ::std::__cxx11::string::~string((string *)local_1f0);
        ::std::__cxx11::string::~string((string *)(condition_2.field_2._M_local_buf + 8));
      }
      else {
        if (CStack_28 != WhileLoop) {
          _continue_type->disable_block_optimization = true;
          Compiler::force_recompile(&this->super_Compiler);
          begin_scope(this);
          return false;
        }
        emit_while_loop_initializers(this,_continue_type);
        (*(this->super_Compiler)._vptr_Compiler[0x38])(this,_continue_type);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_178->condition);
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
        to_expression_abi_cxx11_((string *)local_270,this,uVar2,true);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_178->true_block);
        pSVar4 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar2);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_continue_type->merge_block);
        pSVar5 = Compiler::get<spirv_cross::SPIRBlock>(&this->super_Compiler,uVar2);
        bVar1 = Compiler::execution_is_noop(&this->super_Compiler,pSVar4,pSVar5);
        if (bVar1) {
          enclose_expression(&local_2b0,this,(string *)local_270);
          join<char_const(&)[2],std::__cxx11::string>
                    (&local_290,(spirv_cross *)0x62c6fb,(char (*) [2])&local_2b0,pbVar6);
          ::std::__cxx11::string::operator=((string *)local_270,(string *)&local_290);
          ::std::__cxx11::string::~string((string *)&local_290);
          ::std::__cxx11::string::~string((string *)&local_2b0);
          initializer_1.field_2._8_4_ =
               TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_178->false_block);
        }
        statement<char_const(&)[8],std::__cxx11::string&,char_const(&)[2]>
                  (this,(char (*) [8])"while (",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270,
                   (char (*) [2])0x682405);
        ::std::__cxx11::string::~string((string *)local_270);
      }
      begin_scope(this);
      local_2b4.id = (uint32_t)
                     TypedID::operator_cast_to_TypedID
                               ((TypedID *)&(pSStack_178->super_IVariant).self);
      TypedID<(spirv_cross::Types)6>::TypedID(&local_2b8,initializer_1.field_2._8_4_);
      branch(this,local_2b4,local_2b8);
      this_local._7_1_ = true;
    }
    else {
      _continue_type->disable_block_optimization = true;
      Compiler::force_recompile(&this->super_Compiler);
      begin_scope(this);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerGLSL::attempt_emit_loop_header(SPIRBlock &block, SPIRBlock::Method method)
{
	SPIRBlock::ContinueBlockType continue_type = continue_block_type(get<SPIRBlock>(block.continue_block));

	if (method == SPIRBlock::MergeToSelectForLoop || method == SPIRBlock::MergeToSelectContinueForLoop)
	{
		uint32_t current_count = statement_count;
		// If we're trying to create a true for loop,
		// we need to make sure that all opcodes before branch statement do not actually emit any code.
		// We can then take the condition expression and create a for (; cond ; ) { body; } structure instead.
		emit_block_instructions_with_masked_debug(block);

		bool condition_is_temporary = forced_temporaries.find(block.condition) == end(forced_temporaries);

		bool flushes_phi = flush_phi_required(block.self, block.true_block) ||
		                   flush_phi_required(block.self, block.false_block);

		// This can work! We only did trivial things which could be forwarded in block body!
		if (!flushes_phi && current_count == statement_count && condition_is_temporary)
		{
			switch (continue_type)
			{
			case SPIRBlock::ForLoop:
			{
				// This block may be a dominating block, so make sure we flush undeclared variables before building the for loop header.
				flush_undeclared_variables(block);

				// Important that we do this in this order because
				// emitting the continue block can invalidate the condition expression.
				auto initializer = emit_for_loop_initializers(block);
				auto condition = to_expression(block.condition);

				// Condition might have to be inverted.
				if (execution_is_noop(get<SPIRBlock>(block.true_block), get<SPIRBlock>(block.merge_block)))
					condition = join("!", enclose_expression(condition));

				emit_block_hints(block);
				if (method != SPIRBlock::MergeToSelectContinueForLoop)
				{
					auto continue_block = emit_continue_block(block.continue_block, false, false);
					statement("for (", initializer, "; ", condition, "; ", continue_block, ")");
				}
				else
					statement("for (", initializer, "; ", condition, "; )");
				break;
			}

			case SPIRBlock::WhileLoop:
			{
				// This block may be a dominating block, so make sure we flush undeclared variables before building the while loop header.
				flush_undeclared_variables(block);
				emit_while_loop_initializers(block);
				emit_block_hints(block);

				auto condition = to_expression(block.condition);
				// Condition might have to be inverted.
				if (execution_is_noop(get<SPIRBlock>(block.true_block), get<SPIRBlock>(block.merge_block)))
					condition = join("!", enclose_expression(condition));

				statement("while (", condition, ")");
				break;
			}

			default:
				block.disable_block_optimization = true;
				force_recompile();
				begin_scope(); // We'll see an end_scope() later.
				return false;
			}

			begin_scope();
			return true;
		}
		else
		{
			block.disable_block_optimization = true;
			force_recompile();
			begin_scope(); // We'll see an end_scope() later.
			return false;
		}
	}
	else if (method == SPIRBlock::MergeToDirectForLoop)
	{
		auto &child = get<SPIRBlock>(block.next_block);

		// This block may be a dominating block, so make sure we flush undeclared variables before building the for loop header.
		flush_undeclared_variables(child);

		uint32_t current_count = statement_count;

		// If we're trying to create a true for loop,
		// we need to make sure that all opcodes before branch statement do not actually emit any code.
		// We can then take the condition expression and create a for (; cond ; ) { body; } structure instead.
		emit_block_instructions_with_masked_debug(child);

		bool condition_is_temporary = forced_temporaries.find(child.condition) == end(forced_temporaries);

		bool flushes_phi = flush_phi_required(child.self, child.true_block) ||
		                   flush_phi_required(child.self, child.false_block);

		if (!flushes_phi && current_count == statement_count && condition_is_temporary)
		{
			uint32_t target_block = child.true_block;

			switch (continue_type)
			{
			case SPIRBlock::ForLoop:
			{
				// Important that we do this in this order because
				// emitting the continue block can invalidate the condition expression.
				auto initializer = emit_for_loop_initializers(block);
				auto condition = to_expression(child.condition);

				// Condition might have to be inverted.
				if (execution_is_noop(get<SPIRBlock>(child.true_block), get<SPIRBlock>(block.merge_block)))
				{
					condition = join("!", enclose_expression(condition));
					target_block = child.false_block;
				}

				auto continue_block = emit_continue_block(block.continue_block, false, false);
				emit_block_hints(block);
				statement("for (", initializer, "; ", condition, "; ", continue_block, ")");
				break;
			}

			case SPIRBlock::WhileLoop:
			{
				emit_while_loop_initializers(block);
				emit_block_hints(block);

				auto condition = to_expression(child.condition);
				// Condition might have to be inverted.
				if (execution_is_noop(get<SPIRBlock>(child.true_block), get<SPIRBlock>(block.merge_block)))
				{
					condition = join("!", enclose_expression(condition));
					target_block = child.false_block;
				}

				statement("while (", condition, ")");
				break;
			}

			default:
				block.disable_block_optimization = true;
				force_recompile();
				begin_scope(); // We'll see an end_scope() later.
				return false;
			}

			begin_scope();
			branch(child.self, target_block);
			return true;
		}
		else
		{
			block.disable_block_optimization = true;
			force_recompile();
			begin_scope(); // We'll see an end_scope() later.
			return false;
		}
	}
	else
		return false;
}